

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * __thiscall
testing::internal::CapturedStream::GetCapturedString_abi_cxx11_(CapturedStream *this)

{
  int *in_RSI;
  string *in_RDI;
  FILE *in_stack_00000028;
  FILE *file;
  string *content;
  string *path;
  
  path = in_RDI;
  if (in_RSI[1] != -1) {
    fflush((FILE *)0x0);
    dup2(in_RSI[1],*in_RSI);
    close(in_RSI[1]);
    in_RSI[1] = -1;
  }
  std::__cxx11::string::c_str();
  posix::FOpen((char *)path,(char *)in_RDI);
  ReadEntireFile_abi_cxx11_(in_stack_00000028);
  posix::FClose((FILE *)0x153b1a);
  return path;
}

Assistant:

std::string GetCapturedString() {
    if (uncaptured_fd_ != -1) {
      // Restores the original stream.
      fflush(NULL);
      dup2(uncaptured_fd_, fd_);
      close(uncaptured_fd_);
      uncaptured_fd_ = -1;
    }

    FILE* const file = posix::FOpen(filename_.c_str(), "r");
    const std::string content = ReadEntireFile(file);
    posix::FClose(file);
    return content;
  }